

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O2

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,AbortAssertionExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  VisitResult result;
  bitmask<slang::analysis::VisitFlags> local_5c;
  Clock local_58;
  
  local_5c.m_bits = flags.m_bits;
  local_58 = outerClock;
  ast::AssertionExpr::
  visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
            ((VisitResult *)&stack0xffffffffffffffb0,expr->expr,this,&local_58,&local_5c);
  if (expr->isSync == false) {
    this = (ClockVisitor *)&stack0xffffffffffffffb0;
    VisitResult::VisitResult(__return_storage_ptr__,(VisitResult *)this);
  }
  else {
    inheritedClock(__return_storage_ptr__,this,&expr->super_AssertionExpr,local_58,local_5c);
  }
  SmallVectorBase<const_slang::ast::TimingControl_*>::cleanup
            ((SmallVectorBase<const_slang::ast::TimingControl_*> *)&stack0xffffffffffffffb0,
             (EVP_PKEY_CTX *)this);
  return __return_storage_ptr__;
}

Assistant:

VisitResult visit(const AbortAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        auto result = expr.expr.visit(*this, outerClock, flags);
        if (!expr.isSync)
            return result;
        return inheritedClock(expr, outerClock, flags);
    }